

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Exponentiation_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  double dVar5;
  double y;
  
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aad985;
    *puVar3 = 0;
  }
  if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    dVar5 = (double)(int)aLeft;
  }
  else if ((ulong)aLeft >> 0x32 == 0) {
    dVar5 = JavascriptConversion::ToNumber_Full(aLeft,scriptContext);
  }
  else {
    dVar5 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00aad985:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    y = (double)(int)aRight;
  }
  else if ((ulong)aRight >> 0x32 == 0) {
    y = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
  }
  else {
    y = (double)((ulong)aRight ^ 0xfffc000000000000);
  }
  dVar5 = Math::Pow(dVar5,y);
  pvVar4 = JavascriptNumber::ToVarIntCheck(dVar5,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptMath::Exponentiation_Full(Var aLeft, Var aRight, ScriptContext *scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Exponentiation_Full);
            double x = JavascriptConversion::ToNumber(aLeft, scriptContext);
            double y = JavascriptConversion::ToNumber(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(Math::Pow(x, y), scriptContext);
            JIT_HELPER_END(Op_Exponentiation_Full);
        }